

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * extractFileExt(string *__return_storage_ptr__,string *src)

{
  long lVar1;
  long lVar2;
  string rez;
  
  lVar2 = src->_M_string_length + 1;
  do {
    if (lVar2 == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&rez);
      return __return_storage_ptr__;
    }
    lVar1 = lVar2 + -2;
    lVar2 = lVar2 + -1;
  } while ((src->_M_dataplus)._M_p[lVar1] != '.');
  std::__cxx11::string::substr((ulong)&rez,(ulong)src);
  if ((rez._M_string_length == 0) || (rez._M_dataplus._M_p[rez._M_string_length - 1] != '\"')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rez._M_dataplus._M_p == &rez.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(rez.field_2._M_allocated_capacity._1_7_,rez.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = rez.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = rez._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(rez.field_2._M_allocated_capacity._1_7_,rez.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = rez._M_string_length;
    rez._M_string_length = 0;
    rez.field_2._M_local_buf[0] = '\0';
    rez._M_dataplus._M_p = (pointer)&rez.field_2;
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&rez);
  }
  std::__cxx11::string::~string((string *)&rez);
  return __return_storage_ptr__;
}

Assistant:

string extractFileExt(const string& src)
{
    for (size_t i = src.size() - 1; i > 0; i--)
        if (src[i] == '.')
        {
            string rez = src.substr(i + 1);
            if (!rez.empty() && rez[rez.size() - 1] == '\"')
                return rez.substr(0, rez.size() - 1);
            return rez;
        }
    return "";
}